

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.cpp
# Opt level: O3

void __thiscall arm::CtrlInst::display(CtrlInst *this,ostream *o)

{
  any *this_00;
  int iVar1;
  ostream *poVar2;
  type_info *ptVar3;
  int *piVar4;
  double *pdVar5;
  float *pfVar6;
  void *pvVar7;
  long *plVar8;
  size_t sVar9;
  char *pcVar10;
  long *local_40;
  long local_38;
  long local_30 [2];
  
  this_00 = &this->val;
  if ((this->super_Inst).field_0xd == '\x01') {
    std::__ostream_insert<char,std::char_traits<char>>(o,".",1);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (o,(this->key)._M_dataplus._M_p,(this->key)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    ptVar3 = std::any::type(this_00);
    pcVar10 = *(char **)(ptVar3 + 8);
    if ((pcVar10 == _put) || ((*pcVar10 != '*' && (iVar1 = strcmp(pcVar10,_put), iVar1 == 0)))) {
      piVar4 = (int *)std::__any_caster<int>(this_00);
      if (piVar4 == (int *)0x0) goto LAB_001b432d;
      std::ostream::operator<<(o,*piVar4);
    }
    ptVar3 = std::any::type(this_00);
    pcVar10 = *(char **)(ptVar3 + 8);
    if ((pcVar10 == _what) || ((*pcVar10 != '*' && (iVar1 = strcmp(pcVar10,_what), iVar1 == 0)))) {
      pdVar5 = (double *)std::__any_caster<double>(this_00);
      if (pdVar5 == (double *)0x0) goto LAB_001b432d;
      std::ostream::_M_insert<double>(*pdVar5);
    }
    ptVar3 = std::any::type(this_00);
    pcVar10 = *(char **)(ptVar3 + 8);
    if ((pcVar10 == _str) || ((*pcVar10 != '*' && (iVar1 = strcmp(pcVar10,_str), iVar1 == 0)))) {
      pfVar6 = (float *)std::__any_caster<float>(this_00);
      if (pfVar6 == (float *)0x0) goto LAB_001b432d;
      std::ostream::_M_insert<double>((double)*pfVar6);
    }
    ptVar3 = std::any::type(this_00);
    pcVar10 = *(char **)(ptVar3 + 8);
    if ((pcVar10 == _toupper) ||
       ((*pcVar10 != '*' && (iVar1 = strcmp(pcVar10,_toupper), iVar1 == 0)))) {
      pvVar7 = std::__any_caster<long>(this_00);
      if (pvVar7 == (void *)0x0) goto LAB_001b432d;
      std::ostream::_M_insert<long>((long)o);
    }
    ptVar3 = std::any::type(this_00);
    pcVar10 = *(char **)(ptVar3 + 8);
    if (pcVar10 != "NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE") {
      if (*pcVar10 == '*') {
        return;
      }
      iVar1 = strcmp(pcVar10,"NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE");
      if (iVar1 != 0) {
        return;
      }
    }
    plVar8 = (long *)std::__any_caster<std::__cxx11::string>(this_00);
    if (plVar8 == (long *)0x0) {
LAB_001b432d:
      std::__throw_bad_any_cast();
    }
    local_40 = local_30;
    std::__cxx11::string::_M_construct<char*>((string *)&local_40,*plVar8,plVar8[1] + *plVar8);
    std::__ostream_insert<char,std::char_traits<char>>(o,(char *)local_40,local_38);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(o,"@ ",2);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (o,(this->key)._M_dataplus._M_p,(this->key)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"<",1);
    ptVar3 = std::any::type(this_00);
    pcVar10 = *(char **)(ptVar3 + 8) + (**(char **)(ptVar3 + 8) == '*');
    sVar9 = strlen(pcVar10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar10,sVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,">",1);
    ptVar3 = std::any::type(this_00);
    pcVar10 = *(char **)(ptVar3 + 8);
    if ((pcVar10 == _put) || ((*pcVar10 != '*' && (iVar1 = strcmp(pcVar10,_put), iVar1 == 0)))) {
      std::__ostream_insert<char,std::char_traits<char>>(o,"(value=",7);
      piVar4 = (int *)std::__any_caster<int>(this_00);
      if (piVar4 == (int *)0x0) goto LAB_001b432d;
      poVar2 = (ostream *)std::ostream::operator<<(o,*piVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
    }
    ptVar3 = std::any::type(this_00);
    pcVar10 = *(char **)(ptVar3 + 8);
    if ((pcVar10 == _what) || ((*pcVar10 != '*' && (iVar1 = strcmp(pcVar10,_what), iVar1 == 0)))) {
      std::__ostream_insert<char,std::char_traits<char>>(o,"(value=",7);
      pdVar5 = (double *)std::__any_caster<double>(this_00);
      if (pdVar5 == (double *)0x0) goto LAB_001b432d;
      poVar2 = std::ostream::_M_insert<double>(*pdVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
    }
    ptVar3 = std::any::type(this_00);
    pcVar10 = *(char **)(ptVar3 + 8);
    if ((pcVar10 == _str) || ((*pcVar10 != '*' && (iVar1 = strcmp(pcVar10,_str), iVar1 == 0)))) {
      std::__ostream_insert<char,std::char_traits<char>>(o,"(value=",7);
      pfVar6 = (float *)std::__any_caster<float>(this_00);
      if (pfVar6 == (float *)0x0) goto LAB_001b432d;
      poVar2 = std::ostream::_M_insert<double>((double)*pfVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
    }
    ptVar3 = std::any::type(this_00);
    pcVar10 = *(char **)(ptVar3 + 8);
    if ((pcVar10 == _toupper) ||
       ((*pcVar10 != '*' && (iVar1 = strcmp(pcVar10,_toupper), iVar1 == 0)))) {
      std::__ostream_insert<char,std::char_traits<char>>(o,"(value=",7);
      pvVar7 = std::__any_caster<long>(this_00);
      if (pvVar7 == (void *)0x0) goto LAB_001b432d;
      poVar2 = std::ostream::_M_insert<long>((long)o);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
    }
    ptVar3 = std::any::type(this_00);
    pcVar10 = *(char **)(ptVar3 + 8);
    if (pcVar10 != "NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE") {
      if (*pcVar10 == '*') {
        return;
      }
      iVar1 = strcmp(pcVar10,"NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE");
      if (iVar1 != 0) {
        return;
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>(o,"(value=",7);
    plVar8 = (long *)std::__any_caster<std::__cxx11::string>(this_00);
    if (plVar8 == (long *)0x0) goto LAB_001b432d;
    local_40 = local_30;
    std::__cxx11::string::_M_construct<char*>((string *)&local_40,*plVar8,plVar8[1] + *plVar8);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(o,(char *)local_40,local_38);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
  }
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return;
}

Assistant:

void CtrlInst::display(std::ostream &o) const {
  if (is_asm_option) {
    o << "." << key << " ";
    ctrl_inst_display_type_a(val, int);
    ctrl_inst_display_type_a(val, double);
    ctrl_inst_display_type_a(val, float);
    ctrl_inst_display_type_a(val, long);
    ctrl_inst_display_type_a(val, std::string);
  } else {
    o << "@ " << key << "<" << val.type().name() << ">";
    ctrl_inst_display_type(val, int);
    ctrl_inst_display_type(val, double);
    ctrl_inst_display_type(val, float);
    ctrl_inst_display_type(val, long);
    ctrl_inst_display_type(val, std::string);
  }
}